

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_image::get_block_endpoints
          (dxt_image *this,uint block_x,uint block_y,uint element_index,uint *packed_low_endpoint,
          uint *packed_high_endpoint)

{
  element *peVar1;
  uint uVar2;
  
  if (this->m_element_type[element_index] - cColorDXT1 < 4) {
    peVar1 = this->m_pElements;
    uVar2 = (block_y * this->m_blocks_x + block_x) * this->m_num_elements_per_block + element_index;
    switch(this->m_element_type[element_index]) {
    case cColorDXT1:
      *packed_low_endpoint = (uint)*(ushort *)peVar1[uVar2].m_bytes;
      uVar2 = (uint)*(ushort *)(peVar1[uVar2].m_bytes + 2);
      break;
    case cAlphaDXT3:
      *packed_low_endpoint = 0;
      uVar2 = 0xff;
      break;
    case cAlphaDXT5:
      *packed_low_endpoint = (uint)peVar1[uVar2].m_bytes[0];
      uVar2 = (uint)peVar1[uVar2].m_bytes[1];
      break;
    case cColorETC1:
      if ((peVar1[uVar2].m_bytes[3] & 2) == 0) {
        *packed_low_endpoint =
             (uint)(peVar1[uVar2].m_bytes[0] >> 4) << 8 |
             (uint)(peVar1[uVar2].m_bytes[2] >> 4) | peVar1[uVar2].m_bytes[1] & 0xfffffff0;
        uVar2 = (peVar1[uVar2].m_bytes[0] & 0xf) << 8 |
                (uint)(byte)(peVar1[uVar2].m_bytes[1] << 4) | peVar1[uVar2].m_bytes[2] & 0xf;
      }
      else {
        *packed_low_endpoint =
             (peVar1[uVar2].m_bytes[0] & 0xf8) << 7 |
             (uint)(peVar1[uVar2].m_bytes[2] >> 3) + (peVar1[uVar2].m_bytes[1] & 0xf8) * 4;
        uVar2 = (peVar1[uVar2].m_bytes[0] & 7) << 6 |
                (peVar1[uVar2].m_bytes[2] & 7) + (peVar1[uVar2].m_bytes[1] & 7) * 8;
      }
    }
    *packed_high_endpoint = uVar2;
  }
  return;
}

Assistant:

void dxt_image::get_block_endpoints(uint block_x, uint block_y, uint element_index, uint& packed_low_endpoint, uint& packed_high_endpoint) const
    {
        const element& block = get_element(block_x, block_y, element_index);

        switch (m_element_type[element_index])
        {
        case cColorETC1:
        {
            const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
            if (src_block.get_diff_bit())
            {
                packed_low_endpoint = src_block.get_base5_color();
                packed_high_endpoint = src_block.get_delta3_color();
            }
            else
            {
                packed_low_endpoint = src_block.get_base4_color(0);
                packed_high_endpoint = src_block.get_base4_color(1);
            }

            break;
        }
        case cColorDXT1:
        {
            const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);

            packed_low_endpoint = block1.get_low_color();
            packed_high_endpoint = block1.get_high_color();

            break;
        }
        case cAlphaDXT5:
        {
            const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);

            packed_low_endpoint = block5.get_low_alpha();
            packed_high_endpoint = block5.get_high_alpha();

            break;
        }
        case cAlphaDXT3:
        {
            packed_low_endpoint = 0;
            packed_high_endpoint = 255;

            break;
        }
        default:
            break;
        }
    }